

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::regrid_level_0_on_restart(Amr *this)

{
  int iVar1;
  pointer pGVar2;
  pointer pIVar3;
  pointer puVar4;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  ostream *poVar10;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var11;
  int dir;
  long lVar12;
  undefined8 local_228;
  int local_220;
  undefined1 *local_21c;
  undefined4 local_214;
  BoxArray lev0;
  Box result;
  
  (anonymous_namespace)::regrid_on_restart = 0;
  pGVar2 = (this->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = *(undefined8 *)(pGVar2->domain).smallend.vect;
  uVar7 = *(undefined8 *)((long)&(pGVar2->domain).smallend + 8);
  uVar8 = *(undefined8 *)((long)&(pGVar2->domain).bigend + 8);
  result.bigend.vect[2] = (int)uVar8;
  result.btype.itype = SUB84(uVar8,4);
  result.smallend.vect[2] = (int)uVar7;
  result.smallend.vect[0] = (int)uVar6 >> 1;
  result.smallend.vect[1] = (int)((long)uVar6 >> 0x21);
  result.smallend.vect[2] = result.smallend.vect[2] >> 1;
  local_21c = &DAT_200000002;
  local_214 = 2;
  result.btype.itype = SUB84(uVar8,4);
  result.bigend.vect[2] = (int)uVar8;
  result.bigend.vect[2] = result.bigend.vect[2] >> 1;
  result.bigend.vect[0] = (int)((long)uVar7 >> 0x21);
  result.bigend.vect[1] = (int)((long)*(undefined8 *)(pGVar2->domain).bigend.vect >> 0x21);
  if (result.btype.itype != 0) {
    local_228 = 0;
    local_220 = 0;
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      if (((result.btype.itype >> ((uint)lVar12 & 0x1f) & 1) != 0) &&
         (result.bigend.vect[lVar12] % *(int *)((long)&local_21c + lVar12 * 4) != 0)) {
        *(undefined4 *)((long)&local_228 + lVar12 * 4) = 1;
      }
    }
    result.bigend.vect[0] = (int)local_228 + result.bigend.vect[0];
    result.bigend.vect[1] = (int)((ulong)local_228 >> 0x20) + result.bigend.vect[1];
    result.bigend.vect[2] = result.bigend.vect[2] + local_220;
  }
  BoxArray::BoxArray(&lev0,&result);
  pIVar3 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
           super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_start;
  result.smallend.vect[2] = pIVar3->vect[2] / 2;
  result.smallend.vect._0_8_ =
       (long)pIVar3->vect[1] / 2 << 0x20 | (long)pIVar3->vect[0] / 2 & 0xffffffffU;
  BoxArray::maxSize(&lev0,&result.smallend);
  BoxArray::refine(&lev0,2);
  if (((anonymous_namespace)::use_efficient_regrid == 1) &&
     (bVar9 = BoxArray::operator==
                        (&lev0,(BoxArray *)
                               ((long)(((this->amr_level).
                                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                        .
                                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               + 0xd8)), bVar9)) {
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      poVar10 = OutStream();
      Print::Print((Print *)&result,poVar10);
      std::operator<<((ostream *)(result.bigend.vect + 1),
                      "Regridding at level 0 but grids unchanged \n");
      Print::~Print((Print *)&result);
    }
  }
  else {
    DistributionMapping::DistributionMapping
              ((DistributionMapping *)&result,&lev0,*(int *)(ParallelContext::frames + 0x10));
    _Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)
         (**(code **)(*(long *)this->levelbld + 0x30))
                   (this->cumtime,this->levelbld,this,0,
                    (this->super_AmrCore).super_AmrMesh.geom.
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                    super__Vector_impl_data._M_start,&lev0,&result);
    (**(code **)(*(long *)_Var11.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8))
              (_Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl);
    puVar4 = (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar5.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
          &(puVar4->_M_t).
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    (puVar4->_M_t).super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
         _Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
         super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl;
    if (tVar5.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
      (**(code **)(*(long *)tVar5.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))();
    }
    AmrMesh::SetBoxArray
              ((AmrMesh *)this,0,
               (BoxArray *)
               ((long)(((this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
               + 0xd8));
    AmrMesh::SetDistributionMap
              ((AmrMesh *)this,0,
               (DistributionMapping *)
               ((long)(((this->amr_level).
                        super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
               + 0x140));
    _Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (((this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    (**(code **)(*(long *)_Var11.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x98))
              (_Var11.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,0,0);
    if (*(int *)(ParallelContext::frames + 0xc) == 0) {
      iVar1 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose;
      if (iVar1 < 2) {
        if (iVar1 == 1) {
          poVar10 = OutStream();
          AmrCore::printGridSummary
                    (&this->super_AmrCore,poVar10,0,
                     *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
        }
      }
      else {
        poVar10 = OutStream();
        printGridInfo(this,poVar10,0,
                      *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
    }
    if ((this->record_grid_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
      printGridInfo(this,(ostream *)&this->gridlog,0,
                    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result.smallend.vect + 2));
  }
  BoxArray::~BoxArray(&lev0);
  return;
}

Assistant:

void
Amr::regrid_level_0_on_restart()
{
    regrid_on_restart = 0;
    //
    // Coarsening before we split the grids ensures that each resulting
    // grid will have an even number of cells in each direction.
    //
    BoxArray lev0(amrex::coarsen(Geom(0).Domain(),2));
    //
    // Now split up into list of grids within max_grid_size[0] limit.
    //
    lev0.maxSize(max_grid_size[0]/2);
    //
    // Now refine these boxes back to level 0.
    //
    lev0.refine(2);

    //
    // If use_efficient_regrid flag is set, then test to see whether we in fact
    //    have just changed the level 0 grids. If not, then don't do anything more here.
    //
    if ( !( (use_efficient_regrid == 1) && (lev0 == amr_level[0]->boxArray()) ) )
    {
        //
        // Construct skeleton of new level.
        //
        DistributionMapping dm(lev0);
        AmrLevel* a = (*levelbld)(*this,0,Geom(0),lev0,dm,cumtime);

        a->init(*amr_level[0]);
        amr_level[0].reset(a);

        this->SetBoxArray(0, amr_level[0]->boxArray());
        this->SetDistributionMap(0, amr_level[0]->DistributionMap());

        amr_level[0]->post_regrid(0,0);

        if (ParallelDescriptor::IOProcessor())
        {
            if (verbose > 1)
            {
                printGridInfo(amrex::OutStream(),0,finest_level);
            }
            else if (verbose > 0)
            {
                printGridSummary(amrex::OutStream(),0,finest_level);
            }
        }

        if (record_grid_info && ParallelDescriptor::IOProcessor())
            printGridInfo(gridlog,0,finest_level);
    }
    else
    {
        if (verbose > 0)
            amrex::Print() << "Regridding at level 0 but grids unchanged \n";
    }
}